

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rpc_request.cc
# Opt level: O0

int __thiscall AliRpcRequest::CommitRequest(AliRpcRequest *this)

{
  int iVar1;
  char *buf_in;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string sign;
  string sign_url;
  AliRpcRequest *this_local;
  
  GetSignUrl_abi_cxx11_((string *)((long)&sign.field_2 + 8),this);
  std::operator+(&local_70,&this->secret_,"&");
  buf_in = (char *)std::__cxx11::string::c_str();
  iVar1 = std::__cxx11::string::size();
  encode_compute_hmac_sha1((string *)local_50,&local_70,buf_in,iVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"TimeStamp",&local_a1);
  std::__cxx11::string::string((string *)&local_c8,(string *)&this->utc_time_);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Format",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"JSON",&local_111);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Version",&local_139);
  std::__cxx11::string::string((string *)&local_160,(string *)&this->version_);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"AccessKeyId",&local_181);
  std::__cxx11::string::string((string *)&local_1a8,(string *)&this->appid_);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_180,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"SignatureMethod",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"HMAC-SHA1",&local_1f1);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"SignatureVersion",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"1.0",&local_241);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_218,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"SignatureNonce",&local_269);
  std::__cxx11::string::string((string *)&local_290,(string *)&this->sign_nounce);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_268,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Signature",&local_2b1);
  std::__cxx11::string::string((string *)&local_2d8,(string *)local_50);
  AliHttpRequest::AddRequestQuery(&this->super_AliHttpRequest,&local_2b0,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  iVar1 = AliHttpRequest::CommitRequest(&this->super_AliHttpRequest);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(sign.field_2._M_local_buf + 8));
  return iVar1;
}

Assistant:

int AliRpcRequest::CommitRequest() {
  std::string sign_url = GetSignUrl();
  std::string sign = encode_compute_hmac_sha1(this->secret_ + "&", 
                                              (char*)sign_url.c_str(),
                                              sign_url.size());
  AddRequestQuery("TimeStamp", utc_time_);
  AddRequestQuery("Format", "JSON");
  AddRequestQuery("Version", this->version_);
  AddRequestQuery("AccessKeyId", this->appid_);
  AddRequestQuery("SignatureMethod", "HMAC-SHA1");    
  AddRequestQuery("SignatureVersion", "1.0"); 
  AddRequestQuery("SignatureNonce", this->sign_nounce);
  AddRequestQuery("Signature", sign);
  return AliHttpRequest::CommitRequest();
}